

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_ping_pong.c
# Opt level: O0

cio_error init_client(cio_socket *socket,cio_address_family family,client *client)

{
  undefined1 local_b4 [8];
  cio_socket_address client_endpoint;
  cio_error err;
  cio_inet_address inet_address;
  client *client_local;
  cio_address_family family_local;
  cio_socket *socket_local;
  
  client_endpoint.impl.sa._104_4_ =
       cio_init_inet_address
                 ((cio_inet_address *)(client_endpoint.impl.sa.unix_address.un.sun_path + 0x6a),
                  "\x7f",4);
  if (client_endpoint.impl.sa._104_4_ == CIO_SUCCESS) {
    client_endpoint.impl.sa._104_4_ =
         cio_init_inet_socket_address
                   ((cio_socket_address *)local_b4,
                    (cio_inet_address *)(client_endpoint.impl.sa.unix_address.un.sun_path + 0x6a),
                    0x3039);
    if (client_endpoint.impl.sa._104_4_ == CIO_SUCCESS) {
      client_endpoint.impl.sa._104_4_ =
           cio_socket_init(socket,family,&loop,1000000000,client_socket_close_hook);
      if (client_endpoint.impl.sa._104_4_ == CIO_SUCCESS) {
        client_endpoint.impl.sa._104_4_ = cio_socket_set_tcp_fast_open(socket,true);
        if (client_endpoint.impl.sa._104_4_ == CIO_SUCCESS) {
          client_endpoint.impl.sa._104_4_ =
               cio_socket_connect(socket,(cio_socket_address *)local_b4,handle_connect,client);
          if (client_endpoint.impl.sa._104_4_ == CIO_SUCCESS) {
            return CIO_SUCCESS;
          }
          fprintf(_stderr,"could not connect to server!\n");
        }
        else {
          fprintf(_stderr,"could not enable TCP FASTOPEN for active (connect) socket!\n");
        }
        cio_socket_close(socket);
        socket_local._4_4_ = client_endpoint.impl.sa._104_4_;
      }
      else {
        fprintf(_stderr,"could not init client socket endpoint!\n");
        socket_local._4_4_ = client_endpoint.impl.sa._104_4_;
      }
    }
    else {
      fprintf(_stderr,"could not init client socket endpoint!\n");
      socket_local._4_4_ = client_endpoint.impl.sa._104_4_;
    }
  }
  else {
    fprintf(_stderr,"could not init client socket inet address!\n");
    socket_local._4_4_ = client_endpoint.impl.sa._104_4_;
  }
  return socket_local._4_4_;
}

Assistant:

static enum cio_error init_client(struct cio_socket *socket, enum cio_address_family family, struct client *client)
{
	static const uint8_t CONNECT_IP[4] = {127, 0, 0, 1};
	struct cio_inet_address inet_address;
	enum cio_error err = cio_init_inet_address(&inet_address, CONNECT_IP, sizeof(CONNECT_IP));
	if (cio_unlikely(err != CIO_SUCCESS)) {
		(void)fprintf(stderr, "could not init client socket inet address!\n");
		return err;
	}

	struct cio_socket_address client_endpoint;
	err = cio_init_inet_socket_address(&client_endpoint, &inet_address, SERVERSOCKET_LISTEN_PORT);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		(void)fprintf(stderr, "could not init client socket endpoint!\n");
		return err;
	}

	err = cio_socket_init(socket, family, &loop, CLOSE_TIMEOUT_NS, client_socket_close_hook);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		(void)fprintf(stderr, "could not init client socket endpoint!\n");
		return err;
	}

	err = cio_socket_set_tcp_fast_open(socket, true);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		(void)fprintf(stderr, "could not enable TCP FASTOPEN for active (connect) socket!\n");
		goto close_socket;
	}

	err = cio_socket_connect(socket, &client_endpoint, handle_connect, client);
	if (err != CIO_SUCCESS) {
		(void)fprintf(stderr, "could not connect to server!\n");
		goto close_socket;
	}

	return CIO_SUCCESS;

close_socket:
	cio_socket_close(socket);
	return err;
}